

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void __thiscall
wasm::
CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
::doWalkFunction(CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
                 *this,Function *func)

{
  size_type sVar1;
  size_type sVar2;
  unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
  local_28;
  pointer *local_20;
  RedundantSetElimination *self;
  Function *func_local;
  CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>
  *this_local;
  
  self = (RedundantSetElimination *)func;
  func_local = (Function *)this;
  std::
  vector<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
  ::clear(&this->basicBlocks);
  std::
  map<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_unsigned_long,_std::less<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*const,_unsigned_long>_>_>
  ::clear(&this->debugIds);
  this->exit = (BasicBlock *)0x0;
  this->hasSyntheticExit = false;
  startBasicBlock(this);
  this->entry = this->currBasicBlock;
  Walker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>_>
  ::doWalkFunction((Walker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>_>
                    *)this,(Function *)self);
  if (this->currBasicBlock != (BasicBlock *)0x0) {
    local_20 = &this[-1].processCatchStack.
                super__Vector_base<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    doEndReturn((RedundantSetElimination *)local_20,(Expression **)0x0);
  }
  if ((this->hasSyntheticExit & 1U) != 0) {
    std::
    unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,void>,wasm::(anonymous_namespace)::Info>::BasicBlock,std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,void>,wasm::(anonymous_namespace)::Info>::BasicBlock>>
    ::
    unique_ptr<std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,void>,wasm::(anonymous_namespace)::Info>::BasicBlock>,void>
              ((unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,void>,wasm::(anonymous_namespace)::Info>::BasicBlock,std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,void>,wasm::(anonymous_namespace)::Info>::BasicBlock>>
                *)&local_28,this->exit);
    std::
    vector<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>_>_>
    ::push_back(&this->basicBlocks,(value_type *)&local_28);
    std::
    unique_ptr<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock,_std::default_delete<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock>_>
    ::~unique_ptr(&local_28);
  }
  sVar1 = std::
          map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>_>
          ::size(&this->branches);
  if (sVar1 != 0) {
    __assert_fail("branches.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x255,
                  "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                 );
  }
  sVar2 = std::
          vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
          ::size(&this->ifLastBlockStack);
  if (sVar2 != 0) {
    __assert_fail("ifLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x256,
                  "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                 );
  }
  sVar2 = std::
          vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
          ::size(&this->loopLastBlockStack);
  if (sVar2 != 0) {
    __assert_fail("loopLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,599,
                  "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                 );
  }
  sVar2 = std::
          vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
          ::size(&this->tryLastBlockStack);
  if (sVar2 != 0) {
    __assert_fail("tryLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,600,
                  "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                 );
  }
  sVar2 = std::
          vector<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>
          ::size(&this->throwingInstsStack);
  if (sVar2 != 0) {
    __assert_fail("throwingInstsStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x259,
                  "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                 );
  }
  sVar2 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                    (&this->tryStack);
  if (sVar2 != 0) {
    __assert_fail("tryStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x25a,
                  "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
                 );
  }
  sVar2 = std::
          vector<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::RedundantSetElimination,_wasm::Visitor<wasm::(anonymous_namespace)::RedundantSetElimination,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>
          ::size(&this->processCatchStack);
  if (sVar2 == 0) {
    return;
  }
  __assert_fail("processCatchStack.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                ,0x25b,
                "void wasm::CFGWalker<wasm::(anonymous namespace)::RedundantSetElimination, wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, wasm::(anonymous namespace)::Info>::doWalkFunction(Function *) [SubType = wasm::(anonymous namespace)::RedundantSetElimination, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::RedundantSetElimination>, Contents = wasm::(anonymous namespace)::Info]"
               );
}

Assistant:

void doWalkFunction(Function* func) {
    basicBlocks.clear();
    debugIds.clear();
    exit = nullptr;
    hasSyntheticExit = false;

    startBasicBlock();
    entry = currBasicBlock;
    PostWalker<SubType, VisitorType>::doWalkFunction(func);

    // The last block, if it exists, implicitly returns.
    if (currBasicBlock) {
      auto* self = static_cast<SubType*>(this);
      self->doEndReturn(self, nullptr);
    }

    // If we have a synthetic exit block, add it to the list of basic blocks
    // here so it always comes at the end.
    if (hasSyntheticExit) {
      basicBlocks.push_back(std::unique_ptr<BasicBlock>(exit));
    }

    assert(branches.size() == 0);
    assert(ifLastBlockStack.size() == 0);
    assert(loopLastBlockStack.size() == 0);
    assert(tryLastBlockStack.size() == 0);
    assert(throwingInstsStack.size() == 0);
    assert(tryStack.size() == 0);
    assert(processCatchStack.size() == 0);
  }